

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_folded
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel,bool explicit_key)

{
  csubstr sp;
  csubstr sp_00;
  ro_substr pattern;
  Location loc;
  bool bVar1;
  error_flags eVar2;
  size_t sVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  undefined8 in_RDI;
  byte in_R8B;
  size_t lv_2;
  size_t i_1;
  size_t lv_1;
  size_t lv;
  csubstr since_pos;
  size_t i;
  size_t pos;
  size_t numnewlines_at_end;
  csubstr trimmed;
  char (*in_stack_fffffffffffffe08) [4];
  char c;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe10;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe18;
  Location *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  error_flags in_stack_fffffffffffffe34;
  size_t in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  char (*in_stack_fffffffffffffe60) [44];
  basic_substring<const_char> *pbVar5;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe80;
  undefined7 uVar6;
  char in_stack_fffffffffffffe87;
  undefined1 uVar7;
  basic_substring<const_char> *in_stack_fffffffffffffe88;
  ulong uVar8;
  size_t in_stack_fffffffffffffe90;
  ulong local_160;
  ulong local_148;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  basic_substring<const_char> local_118;
  char (*local_108) [4];
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pWStack_100;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f8;
  Location *pLStack_f0;
  char *local_e8;
  basic_substring<char_const> local_e0 [23];
  byte local_c9;
  long local_c8;
  long local_b0;
  char *local_a8;
  undefined4 local_a0;
  ulong local_98;
  basic_substring<const_char> *local_90;
  char *local_78;
  undefined4 local_70;
  ulong local_68;
  basic_substring<const_char> *local_60;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  ulong local_28;
  ulong local_20;
  basic_substring<const_char> *local_18;
  
  local_c9 = in_R8B & 1;
  local_c8 = in_RCX;
  local_b0 = in_RDX;
  if (local_c9 != 0) {
    WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
              (in_stack_fffffffffffffe10,(char (*) [3])in_stack_fffffffffffffe08);
  }
  basic_substring<char_const>::basic_substring<2ul>(local_e0,(char (*) [2])0x3454c2);
  pattern.len._0_4_ = in_stack_fffffffffffffe68;
  pattern.str = *in_stack_fffffffffffffe60;
  pattern.len._4_4_ = in_stack_fffffffffffffe6c;
  sVar3 = basic_substring<const_char>::find
                    ((basic_substring<const_char> *)
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),pattern,
                     in_stack_fffffffffffffe50);
  if (sVar3 != 0xffffffffffffffff) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                       (size_t)in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08);
    loc.super_LineCol.line = in_RDI;
    loc.super_LineCol.offset = in_stack_fffffffffffffe70;
    loc.super_LineCol.col._0_7_ = in_stack_fffffffffffffe80;
    loc.super_LineCol.col._7_1_ = in_stack_fffffffffffffe87;
    loc.name.str = (char *)in_stack_fffffffffffffe88;
    loc.name.len = in_stack_fffffffffffffe90;
    error<44ul>(in_stack_fffffffffffffe60,loc);
    in_stack_fffffffffffffe08 = local_108;
    in_stack_fffffffffffffe10 = pWStack_100;
    in_stack_fffffffffffffe18 = local_f8;
    in_stack_fffffffffffffe20 = pLStack_f0;
    in_stack_fffffffffffffe28 = local_e8;
  }
  local_118 = basic_substring<const_char>::trimr
                        (in_stack_fffffffffffffe88,in_stack_fffffffffffffe87);
  local_120 = local_b0 - local_118.len;
  if (local_120 == 0) {
    WriterOStream<std::__cxx11::ostringstream>::_do_write<4ul>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  else if (local_120 == 1) {
    WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
              (in_stack_fffffffffffffe10,(char (*) [3])in_stack_fffffffffffffe08);
  }
  else if (1 < local_120) {
    WriterOStream<std::__cxx11::ostringstream>::_do_write<4ul>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  if (local_118.len != 0) {
    local_128 = 0;
    for (local_130 = 0; local_130 < local_118.len; local_130 = local_130 + 1) {
      pbVar5 = &local_118;
      local_68 = local_130;
      local_60 = pbVar5;
      if (local_118.len <= local_130) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_78 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_70 = 0x14c3;
        handle_error(0x344e8b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (pbVar5->str[local_68] == '\n') {
        local_28 = local_130 + 1;
        pbVar5 = &local_118;
        local_20 = local_128;
        local_18 = pbVar5;
        if (local_118.len < local_128) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_38 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_30 = 0x1544;
          handle_error(0x344e8b,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        if (local_28 == 0xffffffffffffffff) {
          local_28 = pbVar5->len;
        }
        if (local_28 < local_20) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_48 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_40 = 0x1546;
          handle_error(0x344e8b,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (pbVar5->len < local_28) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_58 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_50 = 0x1547;
          handle_error(0x344e8b,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
        local_128 = local_130 + 1;
        for (local_148 = 0; local_148 < local_c8 + 1U; local_148 = local_148 + 1) {
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
        }
        sp.len = (size_t)in_stack_fffffffffffffe28;
        sp.str = (char *)in_stack_fffffffffffffe20;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffe18,sp);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
      }
    }
    if (local_128 < local_118.len) {
      for (local_160 = 0; local_160 < local_c8 + 1U; local_160 = local_160 + 1) {
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
      }
      local_90 = &local_118;
      local_98 = local_128;
      if (local_118.len < local_128) {
        in_stack_fffffffffffffe34 = get_error_flags();
        if ((in_stack_fffffffffffffe34 & 1) != 0) {
          bVar1 = is_debugger_attached();
          in_stack_fffffffffffffe30 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe30);
          if (bVar1) {
            trap_instruction();
          }
        }
        local_a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_a0 = 0x1533;
        handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
      sp_00.len = (size_t)in_stack_fffffffffffffe28;
      sp_00.str = (char *)in_stack_fffffffffffffe20;
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffe18,sp_00);
    }
    if (local_120 != 0) {
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
      local_120 = local_120 - 1;
    }
  }
  for (uVar8 = 0; uVar8 < local_120; uVar8 = uVar8 + 1) {
    uVar6 = 0;
    uVar7 = 0;
    while (c = (char)((ulong)in_stack_fffffffffffffe08 >> 0x38),
          CONCAT17(uVar7,uVar6) < local_c8 + 1U) {
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffe10,c);
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
      lVar4 = CONCAT17(uVar7,uVar6) + 1;
      uVar6 = (undefined7)lVar4;
      uVar7 = (undefined1)((ulong)lVar4 >> 0x38);
    }
    if ((uVar8 + 1 < local_120) || ((local_c9 & 1) != 0)) {
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffe10,c);
    }
  }
  if (((local_c9 & 1) != 0) && (local_120 == 0)) {
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(in_stack_fffffffffffffe10,(char)((ulong)in_stack_fffffffffffffe08 >> 0x38));
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_folded(csubstr s, size_t ilevel, bool explicit_key)
{
    if(explicit_key)
    {
        this->Writer::_do_write("? ");
    }
    RYML_ASSERT(s.find("\r") == csubstr::npos);
    csubstr trimmed = s.trimr('\n');
    size_t numnewlines_at_end = s.len - trimmed.len;
    if(numnewlines_at_end == 0)
    {
        this->Writer::_do_write(">-\n");
    }
    else if(numnewlines_at_end == 1)
    {
        this->Writer::_do_write(">\n");
    }
    else if(numnewlines_at_end > 1)
    {
        this->Writer::_do_write(">+\n");
    }
    if(trimmed.len)
    {
        size_t pos = 0; // tracks the last character that was already written
        for(size_t i = 0; i < trimmed.len; ++i)
        {
            if(trimmed[i] != '\n')
                continue;
            // write everything up to this point
            csubstr since_pos = trimmed.range(pos, i+1); // include the newline
            pos = i+1; // because of the newline
            _rymlindent_nextline()
            this->Writer::_do_write(since_pos);
            this->Writer::_do_write('\n'); // write the newline twice
        }
        if(pos < trimmed.len)
        {
            _rymlindent_nextline()
            this->Writer::_do_write(trimmed.sub(pos));
        }
        if(numnewlines_at_end)
        {
            this->Writer::_do_write('\n');
            --numnewlines_at_end;
        }
    }
    for(size_t i = 0; i < numnewlines_at_end; ++i)
    {
        _rymlindent_nextline()
        if(i+1 < numnewlines_at_end || explicit_key)
            this->Writer::_do_write('\n');
    }
    if(explicit_key && !numnewlines_at_end)
        this->Writer::_do_write('\n');
}